

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::prepare
          (RenderFragmentUniformTexelBuffer *this,PrepareRenderPassContext *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  deInt32 dVar1;
  deUint32 viewPortWidth;
  deUint32 viewPortHeight;
  VkResult result;
  Context *pCVar2;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkRenderPass VVar3;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  ProgramBinary *pPVar5;
  VkDeviceSize VVar6;
  Handle<(vk::HandleType)14> *vertexShaderModule_00;
  Handle<(vk::HandleType)14> *fragmentShaderModule_00;
  unsigned_long uVar7;
  size_type sVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  Handle<(vk::HandleType)21> *pHVar10;
  Handle<(vk::HandleType)22> HVar11;
  reference pvVar12;
  reference pvVar13;
  ulong local_788;
  undefined4 local_6a8 [2];
  VkWriteDescriptorSet write;
  VkBufferViewCreateInfo createInfo_1;
  undefined1 local_608 [8];
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayout layout;
  ulong uStack_5d0;
  deUint32 count;
  size_t descriptorSetNdx;
  Handle<(vk::HandleType)22> local_5c0;
  Move<vk::Handle<(vk::HandleType)21>_> local_5b8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_598;
  undefined1 local_578 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize poolSizes;
  undefined1 auStack_538 [4];
  deUint32 descriptorCount;
  pointer pVStack_530;
  pointer local_528;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  local_518;
  VkRenderPass local_500;
  undefined1 local_4f8 [8];
  VkPushConstantRange pushConstantRange;
  VkDescriptorSetLayoutBinding binding;
  VkPhysicalDeviceProperties local_4c8;
  undefined1 local_190 [8];
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  string local_170;
  Move<vk::Handle<(vk::HandleType)14>_> local_150;
  RefData<vk::Handle<(vk::HandleType)14>_> local_130;
  undefined1 local_110 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentShaderModule;
  allocator<char> local_d9;
  string local_d8;
  Move<vk::Handle<(vk::HandleType)14>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexShaderModule;
  deUint32 subpass;
  VkRenderPass renderPass;
  VkDevice device;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vki;
  PrepareRenderPassContext *context_local;
  RenderFragmentUniformTexelBuffer *this_local;
  
  pCVar2 = PrepareRenderPassContext::getContext(context);
  vk = Context::getInstanceInterface(pCVar2);
  pCVar2 = PrepareRenderPassContext::getContext(context);
  physicalDevice_00 = Context::getPhysicalDevice(pCVar2);
  pCVar2 = PrepareRenderPassContext::getContext(context);
  deviceInterface = Context::getDeviceInterface(pCVar2);
  pCVar2 = PrepareRenderPassContext::getContext(context);
  device_00 = Context::getDevice(pCVar2);
  VVar3 = PrepareRenderPassContext::getRenderPass(context);
  vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  pPVar4 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"render-quad.vert",&local_d9);
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_d8);
  ::vk::createShaderModule(&local_b8,deviceInterface,device_00,pPVar5,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface._0_4_ = (int)local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_98.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pPVar4 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"uniform-texel-buffer.frag",
             (allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_170);
  ::vk::createShaderModule(&local_150,deviceInterface,device_00,pPVar5,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data_00.object.m_internal = local_130.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_130.deleter.m_device;
  data_00.deleter.m_allocator = local_130.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_110,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)local_190);
  this->m_device = device_00;
  this->m_vkd = deviceInterface;
  VVar6 = PrepareRenderPassContext::getBufferSize(context);
  this->m_bufferSize = VVar6;
  ::vk::getPhysicalDeviceProperties(&local_4c8,vk,physicalDevice_00);
  this->m_maxUniformTexelCount = local_4c8.limits.maxTexelBufferElements;
  dVar1 = PrepareRenderPassContext::getTargetWidth(context);
  this->m_targetWidth = (long)dVar1;
  dVar1 = PrepareRenderPassContext::getTargetHeight(context);
  this->m_targetHeight = (long)dVar1;
  stack0xfffffffffffffb18 = 0x400000000;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             *)local_190,(value_type *)&pushConstantRange.size);
  pushConstantRange.stageFlags = 0xc;
  local_4f8._0_4_ = 0x10;
  local_4f8._4_4_ = 0;
  local_500 = VVar3;
  vertexShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_78);
  fragmentShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_110);
  viewPortWidth = PrepareRenderPassContext::getTargetWidth(context);
  viewPortHeight = PrepareRenderPassContext::getTargetHeight(context);
  local_518.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector(&local_518);
  _auStack_538 = (pointer)0x0;
  pVStack_530 = (pointer)0x0;
  local_528 = (pointer)0x0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
            *)auStack_538);
  createPipelineWithResources
            (deviceInterface,device_00,local_500,0,vertexShaderModule_00,fragmentShaderModule_00,
             viewPortWidth,viewPortHeight,&local_518,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)auStack_538,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)local_190,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,1,(VkPushConstantRange *)local_4f8,
             &this->m_resources);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)auStack_538);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector(&local_518);
  poolSizes = (VkDescriptorPoolSize)((ulong)this->m_maxUniformTexelCount << 2);
  uVar7 = divRoundUp<unsigned_long>(&this->m_bufferSize,(unsigned_long *)&poolSizes);
  createInfo.pNext._4_4_ = (undefined4)uVar7;
  createInfo.pPoolSizes._0_4_ = 4;
  local_578._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 1;
  createInfo.flags = 1;
  createInfo._24_8_ = &createInfo.pPoolSizes;
  createInfo.pPoolSizes._4_4_ = createInfo.pNext._4_4_;
  ::vk::createDescriptorPool
            (&local_5b8,deviceInterface,device_00,(VkDescriptorPoolCreateInfo *)local_578,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_598,(Move *)&local_5b8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_598.deleter.m_deviceIface;
  data_01.object.m_internal = local_598.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_598.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_598.deleter.m_device;
  data_01.deleter.m_allocator = local_598.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_5b8);
  ::vk::Handle<(vk::HandleType)22>::Handle(&local_5c0,0);
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  resize(&this->m_descriptorSets,uVar7 & 0xffffffff,&local_5c0);
  ::vk::Handle<(vk::HandleType)12>::Handle((Handle<(vk::HandleType)12> *)&descriptorSetNdx,0);
  std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  resize(&this->m_bufferViews,uVar7 & 0xffffffff,(value_type *)&descriptorSetNdx);
  uStack_5d0 = 0;
  while( true ) {
    sVar8 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    if (sVar8 <= uStack_5d0) break;
    if (this->m_bufferSize < (uStack_5d0 + 1) * (ulong)this->m_maxUniformTexelCount * 4) {
      local_788 = this->m_bufferSize + uStack_5d0 * this->m_maxUniformTexelCount * -4;
    }
    else {
      local_788 = (ulong)(this->m_maxUniformTexelCount << 2);
    }
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_resources).descriptorSetLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    allocateInfo.pSetLayouts = (VkDescriptorSetLayout *)pHVar9->m_internal;
    local_608._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    allocateInfo._4_4_ = 0;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    allocateInfo.pNext = (void *)pHVar10->m_internal;
    allocateInfo.descriptorPool.m_internal._0_4_ = 1;
    allocateInfo._24_8_ = &allocateInfo.pSetLayouts;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range,deviceInterface,
               device_00,(VkDescriptorSetAllocateInfo *)local_608);
    HVar11 = ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::disown
                       ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range);
    pvVar12 = std::
              vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
              ::operator[](&this->m_descriptorSets,uStack_5d0);
    pvVar12->m_internal = HVar11.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range);
    write.pTexelBufferView._0_4_ = 0xd;
    createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_1._4_4_ = 0;
    createInfo_1.pNext._0_4_ = 0;
    createInfo_1._16_8_ = PrepareRenderPassContext::getBuffer(context);
    createInfo_1.buffer.m_internal._0_4_ = 0x62;
    createInfo_1._32_8_ = uStack_5d0 * this->m_maxUniformTexelCount * 4;
    createInfo_1.offset = (VkDeviceSize)(uint)((int)(local_788 >> 2) << 2);
    pvVar13 = std::
              vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
              ::operator[](&this->m_bufferViews,uStack_5d0);
    result = (*deviceInterface->_vptr_DeviceInterface[0x23])
                       (deviceInterface,device_00,&write.pTexelBufferView,0,pvVar13);
    ::vk::checkResult(result,
                      "vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                      ,0x19db);
    local_6a8[0] = 0x23;
    write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    write._4_4_ = 0;
    pvVar12 = std::
              vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
              ::operator[](&this->m_descriptorSets,uStack_5d0);
    write.pNext = (void *)pvVar12->m_internal;
    write.dstSet.m_internal._0_4_ = 0;
    write.dstSet.m_internal._4_4_ = 0;
    write.dstBinding = 1;
    write.dstArrayElement = 4;
    write.descriptorCount = 0;
    write.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    write.pImageInfo = (VkDescriptorImageInfo *)0x0;
    write.pBufferInfo =
         (VkDescriptorBufferInfo *)
         std::
         vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
         operator[](&this->m_bufferViews,uStack_5d0);
    (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device_00,1,local_6a8,0,0);
    uStack_5d0 = uStack_5d0 + 1;
  }
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)local_190);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_110);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_78);
  return;
}

Assistant:

void RenderFragmentUniformTexelBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::InstanceInterface&				vki						= context.getContext().getInstanceInterface();
	const vk::VkPhysicalDevice					physicalDevice			= context.getContext().getPhysicalDevice();
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-quad.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("uniform-texel-buffer.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_device				= device;
	m_vkd					= &vkd;
	m_bufferSize			= context.getBufferSize();
	m_maxUniformTexelCount	= vk::getPhysicalDeviceProperties(vki, physicalDevice).limits.maxTexelBufferElements;
	m_targetWidth			= context.getTargetWidth();
	m_targetHeight			= context.getTargetHeight();

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,
			1,
			vk::VK_SHADER_STAGE_FRAGMENT_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}
	const vk::VkPushConstantRange pushConstantRange =
	{
		vk::VK_SHADER_STAGE_FRAGMENT_BIT,
		0u,
		12u
	};

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, 1u, &pushConstantRange, m_resources);

	{
		const deUint32							descriptorCount	= (deUint32)(divRoundUp(m_bufferSize, (vk::VkDeviceSize)m_maxUniformTexelCount * 4));
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
		m_descriptorSets.resize(descriptorCount, (vk::VkDescriptorSet)0);
		m_bufferViews.resize(descriptorCount, (vk::VkBufferView)0);
	}

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const deUint32							count			= (deUint32)(m_bufferSize < (descriptorSetNdx + 1) * m_maxUniformTexelCount * 4
																? m_bufferSize - descriptorSetNdx * m_maxUniformTexelCount * 4
																: m_maxUniformTexelCount * 4) / 4;
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSets[descriptorSetNdx] = vk::allocateDescriptorSet(vkd, device, &allocateInfo).disown();

		{
			const vk::VkBufferViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getBuffer(),
				vk::VK_FORMAT_R32_UINT,
				descriptorSetNdx * m_maxUniformTexelCount * 4,
				count * 4
			};

			VK_CHECK(vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx]));
		}

		{
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSets[descriptorSetNdx],
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,
				DE_NULL,
				DE_NULL,
				&m_bufferViews[descriptorSetNdx]
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}